

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void ifstat(LexState *ls,int line)

{
  int iVar1;
  int local_24;
  FuncState *pFStack_20;
  int escapelist;
  FuncState *fs;
  LexState *pLStack_10;
  int line_local;
  LexState *ls_local;
  
  pFStack_20 = ls->fs;
  local_24 = -1;
  fs._4_4_ = line;
  pLStack_10 = ls;
  test_then_block(ls,&local_24);
  while ((pLStack_10->t).token == 0x105) {
    test_then_block(pLStack_10,&local_24);
  }
  iVar1 = testnext(pLStack_10,0x104);
  if (iVar1 != 0) {
    block(pLStack_10);
  }
  check_match(pLStack_10,0x106,0x10b,fs._4_4_);
  luaK_patchtohere(pFStack_20,local_24);
  return;
}

Assistant:

static void ifstat (LexState *ls, int line) {
  /* ifstat -> IF cond THEN block {ELSEIF cond THEN block} [ELSE block] END */
  FuncState *fs = ls->fs;
  int escapelist = NO_JUMP;  /* exit list for finished parts */
  test_then_block(ls, &escapelist);  /* IF cond THEN block */
  while (ls->t.token == TK_ELSEIF)
    test_then_block(ls, &escapelist);  /* ELSEIF cond THEN block */
  if (testnext(ls, TK_ELSE))
    block(ls);  /* 'else' part */
  check_match(ls, TK_END, TK_IF, line);
  luaK_patchtohere(fs, escapelist);  /* patch escape list to 'if' end */
}